

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_tst_a_32(m68k_info *info)

{
  if ((info->type & 0x1c) != 0) {
    MCInst_setOpcode(info->inst,0x174);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
    get_ea_mode_op(info,(info->extension).operands,info->ir,4);
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_tst_a_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_ea(info, M68K_INS_TST, 4);
}